

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O0

int __thiscall
particleSamples::read_in_particle_samples_UrQMD_mixed_event_binary(particleSamples *this)

{
  byte bVar1;
  void *pvVar2;
  long in_RDI;
  particle_info temp_particle_info;
  float temp_1;
  int i_2;
  float particle_array [9];
  int temp;
  int i_1;
  int info_array [6];
  int ipart;
  int idummy;
  int i;
  int num_particles;
  int urqmd_iso3;
  int urqmd_pid;
  int ievent;
  int n_particle;
  string temp_string;
  char (*in_stack_fffffffffffffd18) [22];
  allocator *in_stack_fffffffffffffd20;
  value_type *in_stack_fffffffffffffd28;
  allocator *in_stack_fffffffffffffd30;
  vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
  *in_stack_fffffffffffffd38;
  particleSamples *in_stack_fffffffffffffd40;
  pretty_ostream *in_stack_fffffffffffffdb8;
  particleSamples *in_stack_fffffffffffffdc0;
  allocator local_1d1;
  string local_1d0 [8];
  string *in_stack_fffffffffffffe38;
  pretty_ostream *in_stack_fffffffffffffe40;
  allocator local_1a9;
  string local_1a8 [39];
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [32];
  int local_138;
  double local_130;
  double local_120;
  double local_118;
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  float local_c0;
  int local_bc;
  float local_b8 [4];
  float local_a8;
  float local_a4;
  float local_a0;
  float local_9c;
  float local_98;
  undefined4 local_90;
  int local_8c;
  undefined4 local_88 [9];
  int local_64;
  undefined4 local_60;
  int local_5c;
  void *local_58;
  int local_3c;
  undefined4 local_38;
  undefined4 local_34;
  int local_30;
  int local_2c;
  string local_28 [40];
  
  clear_out_previous_record(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  std::__cxx11::string::string(local_28);
  local_2c = 0;
  local_30 = 0;
  for (local_3c = 0; local_3c < *(int *)(in_RDI + 0x5f0); local_3c = local_2c + local_3c) {
    std::istream::read((char *)(in_RDI + 0x3d0),(long)&local_2c);
    bVar1 = std::ios::eof();
    if ((bVar1 & 1) != 0) break;
    pvVar2 = operator_new(0x18);
    std::vector<particle_info,_std::allocator<particle_info>_>::vector
              ((vector<particle_info,_std::allocator<particle_info>_> *)0x14b743);
    local_58 = pvVar2;
    std::
    vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
    ::push_back((vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                 *)in_stack_fffffffffffffd20,(value_type *)in_stack_fffffffffffffd18);
    for (local_5c = 0; local_5c < 8; local_5c = local_5c + 1) {
      local_60 = 0;
      std::istream::read((char *)(in_RDI + 0x3d0),(long)&local_60);
    }
    for (local_64 = 0; local_64 < local_2c; local_64 = local_64 + 1) {
      for (local_8c = 0; local_8c < 6; local_8c = local_8c + 1) {
        std::istream::read((char *)(in_RDI + 0x3d0),(long)&local_90);
        local_88[local_8c] = local_90;
      }
      local_34 = local_88[0];
      local_38 = local_88[1];
      for (local_bc = 0; local_bc < 9; local_bc = local_bc + 1) {
        std::istream::read((char *)(in_RDI + 0x3d0),(long)&local_c0);
        local_b8[local_bc] = local_c0;
      }
      local_138 = get_pdg_id(in_stack_fffffffffffffdc0,
                             (int)((ulong)in_stack_fffffffffffffdb8 >> 0x20),
                             (int)in_stack_fffffffffffffdb8);
      local_130 = (double)local_b8[0];
      local_e8 = (double)local_b8[1];
      local_100 = (double)local_b8[2];
      local_f8 = (double)local_b8[3];
      local_f0 = (double)local_a8;
      local_108 = (double)local_a4;
      local_120 = (double)local_a0;
      local_118 = (double)local_9c;
      local_110 = (double)local_98;
      if (local_138 == 0) {
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffffd20,
                   (char (*) [7])in_stack_fffffffffffffd18);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffffd20,(int *)in_stack_fffffffffffffd18);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_158,"error",&local_159);
        pretty_ostream::flush(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
        std::__cxx11::string::~string(local_158);
        std::allocator<char>::~allocator((allocator<char> *)&local_159);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffffd20,
                   (char (*) [14])in_stack_fffffffffffffd18);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffffd20,(int *)in_stack_fffffffffffffd18);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffffd20,
                   (char (*) [11])in_stack_fffffffffffffd18);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffffd20,(int *)in_stack_fffffffffffffd18);
        in_stack_fffffffffffffdc0 = (particleSamples *)(in_RDI + 0x30);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_180,"error",&local_181);
        pretty_ostream::flush(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
        std::__cxx11::string::~string(local_180);
        std::allocator<char>::~allocator((allocator<char> *)&local_181);
        in_stack_fffffffffffffdb8 =
             pretty_ostream::operator<<
                       ((pretty_ostream *)in_stack_fffffffffffffd20,
                        (char (*) [8])in_stack_fffffffffffffd18);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffffd20,(double *)in_stack_fffffffffffffd18);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffffd20,
                   (char (*) [7])in_stack_fffffffffffffd18);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffffd20,(double *)in_stack_fffffffffffffd18);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffffd20,
                   (char (*) [8])in_stack_fffffffffffffd18);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffffd20,(double *)in_stack_fffffffffffffd18);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffffd20,
                   (char (*) [8])in_stack_fffffffffffffd18);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffffd20,(double *)in_stack_fffffffffffffd18);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffffd20,
                   (char (*) [8])in_stack_fffffffffffffd18);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffffd20,(double *)in_stack_fffffffffffffd18);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffffd20,
                   (char (*) [7])in_stack_fffffffffffffd18);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffffd20,(double *)in_stack_fffffffffffffd18);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffffd20,
                   (char (*) [7])in_stack_fffffffffffffd18);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffffd20,(double *)in_stack_fffffffffffffd18);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffffd20,
                   (char (*) [7])in_stack_fffffffffffffd18);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffffd20,(double *)in_stack_fffffffffffffd18);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffffd20,
                   (char (*) [7])in_stack_fffffffffffffd18);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffffd20,(double *)in_stack_fffffffffffffd18);
        in_stack_fffffffffffffd28 = (value_type *)(in_RDI + 0x30);
        in_stack_fffffffffffffd30 = &local_1a9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1a8,"error",in_stack_fffffffffffffd30);
        pretty_ostream::flush(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
        std::__cxx11::string::~string(local_1a8);
        std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
        pretty_ostream::operator<<
                  ((pretty_ostream *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
        in_stack_fffffffffffffd18 = (char (*) [22])(in_RDI + 0x30);
        in_stack_fffffffffffffd20 = &local_1d1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1d0,"error",in_stack_fffffffffffffd20);
        pretty_ostream::flush(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
        std::__cxx11::string::~string(local_1d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
      }
      else {
        std::
        vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
        ::operator[](*(vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                       **)(in_RDI + 0x698),(long)local_30);
        std::vector<particle_info,_std::allocator<particle_info>_>::push_back
                  ((vector<particle_info,_std::allocator<particle_info>_> *)
                   in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
      }
    }
    local_30 = local_30 + 1;
  }
  std::__cxx11::string::~string(local_28);
  return 0;
}

Assistant:

int particleSamples::read_in_particle_samples_UrQMD_mixed_event_binary() {
    // clean out the previous record
    clear_out_previous_record(full_particle_list_mixed_event);

    std::string temp_string;
    int n_particle = 0;
    int ievent = 0;
    int urqmd_pid, urqmd_iso3;
    int num_particles = 0;
    while (num_particles < event_buffer_size) {
        inputfile_mixed_event.read(
            reinterpret_cast<char *>(&n_particle), sizeof(int));
        if (inputfile_mixed_event.eof()) break;

        full_particle_list_mixed_event->push_back(new vector<particle_info>);

        // then get one useless line
        for (int i = 0; i < 8; i++) {
            int idummy = 0;
            inputfile_mixed_event.read(
                reinterpret_cast<char *>(&idummy), sizeof(int));
        }

        for (int ipart = 0; ipart < n_particle; ipart++) {
            int info_array[6];
            for (int i = 0; i < 6; i++) {
                int temp;
                inputfile_mixed_event.read(
                    reinterpret_cast<char *>(&temp), sizeof(int));
                info_array[i] = temp;
            }
            urqmd_pid = info_array[0];
            urqmd_iso3 = info_array[1];

            float particle_array[9];
            for (int i = 0; i < 9; i++) {
                float temp;
                inputfile_mixed_event.read(
                    reinterpret_cast<char *>(&temp), sizeof(float));
                particle_array[i] = temp;
            }

            particle_info temp_particle_info;
            temp_particle_info.monval = get_pdg_id(urqmd_pid, urqmd_iso3);
            temp_particle_info.mass = particle_array[0];
            temp_particle_info.t = particle_array[1];
            temp_particle_info.x = particle_array[2];
            temp_particle_info.y = particle_array[3];
            temp_particle_info.z = particle_array[4];
            temp_particle_info.E = particle_array[5];
            temp_particle_info.px = particle_array[6];
            temp_particle_info.py = particle_array[7];
            temp_particle_info.pz = particle_array[8];
            if (temp_particle_info.monval == 0) {
                messager << "nev = " << ievent;
                messager.flush("error");
                messager << "nparticles = " << n_particle
                         << ", ipart = " << ipart;
                messager.flush("error");
                messager << "mass = " << temp_particle_info.mass
                         << ", E = " << temp_particle_info.E
                         << ", px = " << temp_particle_info.px
                         << ", py = " << temp_particle_info.py
                         << ", pz = " << temp_particle_info.pz
                         << ", t = " << temp_particle_info.t
                         << ", x = " << temp_particle_info.x
                         << ", y = " << temp_particle_info.y
                         << ", z = " << temp_particle_info.z;
                messager.flush("error");
                messager << "Ignore this particle!";
                messager.flush("error");
            } else {
                (*full_particle_list_mixed_event)[ievent]->push_back(
                    temp_particle_info);
            }
        }
        num_particles += n_particle;
        ievent++;
    }
    return (0);
}